

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDop.cpp
# Opt level: O0

KDop<16U> * __thiscall NBvh3::KDop<16U>::operator+=(KDop<16U> *this,SVertex *vertex)

{
  uint local_3c;
  float local_38;
  uint i;
  float dists [8];
  SVertex *vertex_local;
  KDop<16U> *this_local;
  
  dists._24_8_ = vertex;
  getDistances<8u>(vertex,&local_38);
  for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
    setMinMax((&local_38)[local_3c],this->mMin + local_3c,this->mMax + local_3c);
  }
  return this;
}

Assistant:

KDop<K>& KDop<K>::operator += (const SVertex& vertex)
{
    float dists[K / 2];
    getDistances<K / 2>(vertex, dists);
    for(unsigned i = 0; i < K / 2; ++i)
    {
        setMinMax(dists[i], mMin[i], mMax[i]);
    }

    return *this;
}